

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextNextGenBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::UnlockCommandQueue
          (DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *this)

{
  RenderDeviceVkImpl *this_00;
  SoftwareQueueIndex QueueInd;
  string msg;
  string local_30;
  
  if ((this->super_DeviceContextBase<Diligent::EngineVkImplTraits>).m_Desc.IsDeferred == true) {
    FormatString<char[52]>
              (&local_30,(char (*) [52])"Deferred contexts have no associated command queues");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"UnlockCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/DeviceContextNextGenBase.hpp"
               ,0x4a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (this->super_DeviceContextBase<Diligent::EngineVkImplTraits>).m_pDevice.m_pObject;
  QueueInd = GetCommandQueueId(this);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::UnlockCommandQueue
            (&this_00->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ,QueueInd);
  return;
}

Assistant:

UnlockCommandQueue() override final
    {
        DEV_CHECK_ERR(!this->IsDeferred(), "Deferred contexts have no associated command queues");
        this->m_pDevice->UnlockCommandQueue(this->GetCommandQueueId());
    }